

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertionexception.h
# Opt level: O1

void __thiscall
snowhouse::AssertionException::AssertionException
          (AssertionException *this,string *message,string *fileName,uint line)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__AssertionException_0011dd28;
  (this->m_message)._M_dataplus._M_p = (pointer)&(this->m_message).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_message,pcVar1,pcVar1 + message->_M_string_length);
  (this->m_fileName)._M_dataplus._M_p = (pointer)&(this->m_fileName).field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_fileName,pcVar1,pcVar1 + fileName->_M_string_length);
  this->m_line = line;
  return;
}

Assistant:

AssertionException(const std::string& message, const std::string& fileName, unsigned int line)
        : m_message(message), m_fileName(fileName), m_line(line)
      {}